

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_service.hpp
# Opt level: O1

int __thiscall
asio::experimental::detail::channel_service<asio::detail::null_mutex>::shutdown
          (channel_service<asio::detail::null_mutex> *this,int __fd,int __how)

{
  base_implementation_type *pbVar1;
  int extraout_EAX;
  channel_operation *pcVar2;
  op_queue<asio::experimental::detail::channel_operation> local_28;
  
  local_28.front_ = (channel_operation *)0x0;
  local_28.back_ = (channel_operation *)0x0;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  for (pbVar1 = this->impl_list_; pbVar1 != (base_implementation_type *)0x0; pbVar1 = pbVar1->next_)
  {
    pcVar2 = (pbVar1->waiters_).front_;
    if (pcVar2 != (channel_operation *)0x0) {
      if (local_28.back_ != (channel_operation *)0x0) {
        (local_28.back_)->next_ = pcVar2;
        pcVar2 = local_28.front_;
      }
      local_28.back_ = (pbVar1->waiters_).back_;
      (pbVar1->waiters_).front_ = (channel_operation *)0x0;
      (pbVar1->waiters_).back_ = (channel_operation *)0x0;
      local_28.front_ = pcVar2;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  asio::detail::op_queue<asio::experimental::detail::channel_operation>::~op_queue(&local_28);
  return extraout_EAX;
}

Assistant:

inline void channel_service<Mutex>::shutdown()
{
  // Abandon all pending operations.
  asio::detail::op_queue<channel_operation> ops;
  asio::detail::mutex::scoped_lock lock(mutex_);
  base_implementation_type* impl = impl_list_;
  while (impl)
  {
    ops.push(impl->waiters_);
    impl = impl->next_;
  }
}